

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

xmlAttrPtr xmlFormatProp(xmlNodePtr node,xmlChar *name,char *format,...)

{
  xmlChar *pxVar1;
  xmlAttrPtr pxVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  xmlAttrPtr attr;
  xmlChar *xml_str;
  va_list vargs;
  
  pxVar1 = xml_secure_vprint(&stack0x00000008,(__va_list_tag *)0x3000000018);
  pxVar2 = (xmlAttrPtr)xmlNewProp(in_RDI,in_RSI,pxVar1);
  (*_xmlFree)(pxVar1);
  return pxVar2;
}

Assistant:

static xmlAttrPtr xmlFormatProp(xmlNodePtr node, const xmlChar* name, const char *format, ...)
{
    va_list vargs;
    va_start(vargs, format);
    xmlChar *xml_str = xml_secure_vprint(format, vargs);
    va_end(vargs);

    xmlAttrPtr attr = xmlNewProp(node, name, xml_str);
    xmlFree(xml_str);

    return attr;
}